

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

Expression * __thiscall
soul::BlockBuilder::createIntegerChangedByOne(BlockBuilder *this,Expression *v,Op op)

{
  bool condition;
  int iVar1;
  undefined4 extraout_var;
  Constant *pCVar2;
  Expression *pEVar3;
  CodeLocation local_d0 [2];
  Value local_b0;
  Value local_70;
  Constant *local_30;
  Constant *one;
  Type *type;
  Expression *pEStack_18;
  Op op_local;
  Expression *v_local;
  BlockBuilder *this_local;
  
  type._4_4_ = op;
  pEStack_18 = v;
  v_local = (Expression *)this;
  iVar1 = (*(v->super_Object)._vptr_Object[2])();
  one = (Constant *)CONCAT44(extraout_var,iVar1);
  condition = Type::isInteger((Type *)one);
  checkAssertion(condition,"type.isInteger()","createIntegerChangedByOne",0xec);
  soul::Value::createInt32<int>(&local_b0,1);
  soul::Value::castToTypeExpectingSuccess(&local_70,&local_b0,(Type *)one);
  pCVar2 = createConstant(this,&local_70);
  soul::Value::~Value(&local_70);
  soul::Value::~Value(&local_b0);
  local_30 = pCVar2;
  CodeLocation::CodeLocation(local_d0,&(pEStack_18->super_Object).location);
  pEVar3 = createBinaryOp(this,local_d0,pEStack_18,&local_30->super_Expression,type._4_4_);
  CodeLocation::~CodeLocation(local_d0);
  return pEVar3;
}

Assistant:

heart::Expression& createIntegerChangedByOne (heart::Expression& v, BinaryOp::Op op)
    {
        const auto& type = v.getType();
        SOUL_ASSERT (type.isInteger());
        auto& one = createConstant (Value::createInt32 (1).castToTypeExpectingSuccess (type));
        return createBinaryOp (v.location, v, one, op);
    }